

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_Choice.H
# Opt level: O1

void __thiscall Fl_Input_Choice::resize(Fl_Input_Choice *this,int X,int Y,int W,int H)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Input *pFVar5;
  InputMenuButton *pIVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  Fl_Group::resize(&this->super_Fl_Group,X,Y,W,H);
  pFVar5 = this->inp_;
  iVar1 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar7 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar8 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar3 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar9 = Fl::box_dw((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar4 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar10 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (*(pFVar5->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[4])
            (pFVar5,(ulong)(uint)(iVar1 + iVar7),(ulong)(uint)(iVar2 + iVar8),
             (ulong)((iVar3 - iVar9) - 0x14),(ulong)(uint)(iVar4 - iVar10));
  pIVar6 = this->menu_;
  iVar1 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar7 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar3 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar8 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar4 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar9 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (*(pIVar6->super_Fl_Menu_Button).super_Fl_Menu_.super_Fl_Widget._vptr_Fl_Widget[4])
            (pIVar6,(ulong)(((iVar1 + iVar2) - iVar7) - 0x14),(ulong)(uint)(iVar3 + iVar8),0x14,
             (ulong)(uint)(iVar4 - iVar9));
  return;
}

Assistant:

void resize(int X, int Y, int W, int H) {
    Fl_Group::resize(X,Y,W,H);
    inp_->resize(inp_x(), inp_y(), inp_w(), inp_h());
    menu_->resize(menu_x(), menu_y(), menu_w(), menu_h());
  }